

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O0

Url * __thiscall
kj::Url::parse(Url *__return_storage_ptr__,Url *this,StringPtr url,Context context,Options options)

{
  StringPtr text;
  NullableValue<kj::Url> *pNVar1;
  Url *pUVar2;
  Fault local_318 [3];
  Options local_2fa;
  Url *local_2f8;
  char *pcStack_2f0;
  Maybe<kj::Url> local_2e0;
  undefined1 local_1f8 [8];
  NullableValue<kj::Url> _kj_result;
  Context context_local;
  Options options_local;
  StringPtr url_local;
  
  pcStack_2f0 = url.content.ptr;
  local_2fa = SUB42(context,0);
  text.content.size_ = (size_t)pcStack_2f0;
  text.content.ptr = (char *)this;
  local_2f8 = this;
  _context_local = this;
  tryParse(&local_2e0,text,(Context)url.content.size_,local_2fa);
  pNVar1 = kj::_::readMaybe<kj::Url>(&local_2e0);
  kj::_::NullableValue<kj::Url>::NullableValue((NullableValue<kj::Url> *)local_1f8,pNVar1);
  Maybe<kj::Url>::~Maybe(&local_2e0);
  pUVar2 = kj::_::NullableValue::operator_cast_to_Url_((NullableValue *)local_1f8);
  if (pUVar2 != (Url *)0x0) {
    pNVar1 = mv<kj::_::NullableValue<kj::Url>>((NullableValue<kj::Url> *)local_1f8);
    kj::_::NullableValue<kj::Url>::NullableValue
              ((NullableValue<kj::Url> *)&_kj_result.field_1.value.options,pNVar1);
    kj::_::NullableValue<kj::Url>::~NullableValue((NullableValue<kj::Url> *)local_1f8);
    pUVar2 = kj::_::NullableValue<kj::Url>::operator*
                       ((NullableValue<kj::Url> *)&_kj_result.field_1.value.options);
    Url(__return_storage_ptr__,pUVar2);
    kj::_::NullableValue<kj::Url>::~NullableValue
              ((NullableValue<kj::Url> *)&_kj_result.field_1.value.options);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[12],kj::StringPtr&>
            (local_318,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/url.c++"
             ,0xa5,FAILED,"tryParse(url, context, options) != nullptr","\"invalid URL\", url",
             (char (*) [12])"invalid URL",(StringPtr *)&context_local);
  kj::_::Debug::Fault::fatal(local_318);
}

Assistant:

Url Url::parse(StringPtr url, Context context, Options options) {
  return KJ_REQUIRE_NONNULL(tryParse(url, context, options), "invalid URL", url);
}